

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_pred_weight_table(bitstream *str,h264_slice *slice,h264_pred_weight_table *table)

{
  uint uVar1;
  uint local_28;
  uint local_24;
  int i;
  int ret;
  h264_pred_weight_table *table_local;
  h264_slice *slice_local;
  bitstream *str_local;
  
  uVar1 = vs_ue(str,&table->luma_log2_weight_denom);
  local_24 = vs_ue(str,&table->chroma_log2_weight_denom);
  local_24 = local_24 | uVar1;
  for (local_28 = 0; local_28 <= slice->num_ref_idx_l0_active_minus1; local_28 = local_28 + 1) {
    uVar1 = h264_pred_weight_table_entry(str,table,table->l0 + (int)local_28);
    local_24 = uVar1 | local_24;
  }
  if (slice->slice_type % 5 == 1) {
    for (local_28 = 0; local_28 <= slice->num_ref_idx_l1_active_minus1; local_28 = local_28 + 1) {
      uVar1 = h264_pred_weight_table_entry(str,table,table->l1 + (int)local_28);
      local_24 = uVar1 | local_24;
    }
  }
  return local_24;
}

Assistant:

int h264_pred_weight_table(struct bitstream *str, struct h264_slice *slice, struct h264_pred_weight_table *table) {
	int ret = 0;
	ret |= vs_ue(str, &table->luma_log2_weight_denom);
	ret |= vs_ue(str, &table->chroma_log2_weight_denom);
	int i;
	for (i = 0; i <= slice->num_ref_idx_l0_active_minus1; i++)
		ret |= h264_pred_weight_table_entry(str, table, &table->l0[i]);
	if (slice->slice_type % 5 == 1)
		for (i = 0; i <= slice->num_ref_idx_l1_active_minus1; i++)
			ret |= h264_pred_weight_table_entry(str, table, &table->l1[i]);
	return ret;
}